

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servslkf.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleLocaleKeyFactory::SimpleLocaleKeyFactory
          (SimpleLocaleKeyFactory *this,UObject *objToAdopt,Locale *locale,int32_t kind,
          int32_t coverage)

{
  int32_t coverage_local;
  int32_t kind_local;
  Locale *locale_local;
  UObject *objToAdopt_local;
  SimpleLocaleKeyFactory *this_local;
  
  LocaleKeyFactory::LocaleKeyFactory(&this->super_LocaleKeyFactory,coverage);
  (this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleLocaleKeyFactory_004b14a8;
  this->_obj = objToAdopt;
  UnicodeString::UnicodeString(&this->_id);
  this->_kind = kind;
  LocaleUtility::initNameFromLocale(locale,&this->_id);
  return;
}

Assistant:

SimpleLocaleKeyFactory::SimpleLocaleKeyFactory(UObject* objToAdopt,
                                               const Locale& locale,
                                               int32_t kind,
                                               int32_t coverage)
  : LocaleKeyFactory(coverage)
  , _obj(objToAdopt)
  , _id()
  , _kind(kind)
{
    LocaleUtility::initNameFromLocale(locale, _id);
}